

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_andnot(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint32_t uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  roaring_bitmap_t *prVar4;
  roaring_array_t *prVar5;
  container_t *pcVar6;
  container_t *c2_00;
  _Bool local_79;
  _Bool local_6d;
  int next_pos1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  int32_t iStack_48;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  roaring_bitmap_t *empty_bitmap;
  uint32_t local_28;
  int length2;
  int length1;
  uint8_t result_type;
  roaring_bitmap_t *x2_local;
  roaring_bitmap_t *x1_local;
  
  length2._3_1_ = '\0';
  local_28 = (x1->high_low_container).size;
  empty_bitmap._4_4_ = (x2->high_low_container).size;
  _length1 = &x2->high_low_container;
  x2_local = x1;
  if (local_28 == 0) {
    prVar4 = roaring_bitmap_create();
    answer = prVar4;
    _Var2 = is_cow(x2_local);
    local_6d = false;
    if (_Var2) {
      local_6d = is_cow((roaring_bitmap_t *)_length1);
    }
    roaring_bitmap_set_copy_on_write(prVar4,local_6d);
    x1_local = answer;
  }
  else if (empty_bitmap._4_4_ == 0) {
    x1_local = roaring_bitmap_copy(x1);
  }
  else {
    prVar5 = &roaring_bitmap_create_with_capacity(local_28)->high_low_container;
    _pos2 = prVar5;
    _Var2 = is_cow(x2_local);
    local_79 = false;
    if (_Var2) {
      local_79 = is_cow((roaring_bitmap_t *)_length1);
    }
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)prVar5,local_79);
    _s1 = 0;
    iStack_48 = 0;
    c1._4_2_ = 0;
    c1._2_2_ = 0;
    do {
      while( true ) {
        while( true ) {
          c1._4_2_ = ra_get_key_at_index(&x2_local->high_low_container,(uint16_t)_s1);
          c1._2_2_ = ra_get_key_at_index(_length1,(uint16_t)iStack_48);
          if (c1._4_2_ != c1._2_2_) break;
          pcVar6 = ra_get_container_at_index
                             (&x2_local->high_low_container,(uint16_t)_s1,(uint8_t *)((long)&c1 + 7)
                             );
          c2_00 = ra_get_container_at_index(_length1,(uint16_t)iStack_48,(uint8_t *)((long)&c1 + 6))
          ;
          pcVar6 = container_andnot(pcVar6,c1._7_1_,c2_00,c1._6_1_,(uint8_t *)((long)&length2 + 3));
          _Var2 = container_nonzero_cardinality(pcVar6,length2._3_1_);
          if (_Var2) {
            ra_append(_pos2,c1._4_2_,pcVar6,length2._3_1_);
          }
          else {
            container_free(pcVar6,length2._3_1_);
          }
          _s1 = _s1 + 1;
          iStack_48 = iStack_48 + 1;
          if ((_s1 == local_28) || (iStack_48 == empty_bitmap._4_4_)) goto LAB_00145316;
        }
        if (c1._2_2_ <= c1._4_2_) break;
        uVar3 = ra_advance_until(&x2_local->high_low_container,c1._2_2_,_s1);
        prVar4 = x2_local;
        prVar5 = _pos2;
        uVar1 = _s1;
        _Var2 = is_cow(x2_local);
        ra_append_copy_range(prVar5,&prVar4->high_low_container,uVar1,uVar3,_Var2);
        _s1 = uVar3;
        if (uVar3 == local_28) goto LAB_00145316;
      }
      iStack_48 = ra_advance_until(_length1,c1._4_2_,iStack_48);
    } while (iStack_48 != empty_bitmap._4_4_);
LAB_00145316:
    prVar4 = x2_local;
    uVar3 = local_28;
    prVar5 = _pos2;
    uVar1 = _s1;
    if (iStack_48 == empty_bitmap._4_4_) {
      _Var2 = is_cow(x2_local);
      ra_append_copy_range(prVar5,&prVar4->high_low_container,uVar1,uVar3,_Var2);
    }
    x1_local = (roaring_bitmap_t *)_pos2;
  }
  return x1_local;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_andnot(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        roaring_bitmap_t *empty_bitmap = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(empty_bitmap, is_cow(x1) && is_cow(x2));
        return empty_bitmap;
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(length1);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));

    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = 0;
    uint16_t s2 = 0;
    while (true) {
        s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_andnot(c1, type1, c2, type2,
                                              &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
        } else if (s1 < s2) {  // s1 < s2
            const int next_pos1 =
                ra_advance_until(&x1->high_low_container, s2, pos1);
            ra_append_copy_range(&answer->high_low_container,
                                 &x1->high_low_container, pos1, next_pos1,
                                 is_cow(x1));
            // TODO : perhaps some of the copy_on_write should be based on
            // answer rather than x1 (more stringent?).  Many similar cases
            pos1 = next_pos1;
            if (pos1 == length1) break;
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
            if (pos2 == length2) break;
        }
    }
    if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}